

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpring2Constraint::setFrames
          (btGeneric6DofSpring2Constraint *this,btTransform *frameA,btTransform *frameB)

{
  btGeneric6DofSpring2Constraint *in_RDI;
  btTransform *in_stack_ffffffffffffffd8;
  
  btTransform::operator=((btTransform *)in_RDI,in_stack_ffffffffffffffd8);
  btTransform::operator=((btTransform *)in_RDI,in_stack_ffffffffffffffd8);
  (**(code **)(*(long *)((btVector3 *)&(in_RDI->super_btTypedConstraint)._vptr_btTypedConstraint)->
                        m_floats + 0x10))();
  calculateTransforms(in_RDI);
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::setFrames(const btTransform& frameA, const btTransform& frameB)
{
	m_frameInA = frameA;
	m_frameInB = frameB;
	buildJacobian();
	calculateTransforms();
}